

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_stat_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,int stat_type,
              LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  int stat_type_local;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    sftp_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ = sftp_stat(sftp,path,path_len,stat_type,attrs);
      if (((entry_time._4_4_ != -0x25) || (sftp->channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (sftp->channel->session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(sftp->channel->session,start_time);
    } while (entry_time._4_4_ == 0);
    sftp_local._4_4_ = entry_time._4_4_;
  }
  return sftp_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_stat_ex(LIBSSH2_SFTP *sftp, const char *path,
                     unsigned int path_len, int stat_type,
                     LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_stat(sftp, path, path_len, stat_type, attrs));
    return rc;
}